

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::PrintStatistics
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,Index i)

{
  int iVar1;
  ostream *poVar2;
  uint uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  string local_1c0 [32];
  stringstream stats;
  undefined1 local_190 [376];
  
  iVar1 = this->_m_verbosity;
  uVar3 = 100000;
  if (1 < iVar1) {
    uVar3 = 5;
    if (iVar1 - 1U < 5) {
      uVar3 = iVar1 - 1U;
    }
    dVar4 = pow(10.0,(double)(int)uVar3);
    iVar1 = this->_m_verbosity;
    auVar5._0_8_ = 100000.0 / dVar4;
    auVar5._8_8_ = 0;
    uVar3 = vcvttsd2usi_avx512f(auVar5);
  }
  if (((-1 < iVar1) && (uVar3 < i)) && (i % uVar3 == 0)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stats);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
    poVar2 = std::operator<<(poVar2,"-th node selected for expansion:   ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," nodes in queue ( ");
    dVar4 = GetPerJPRatio(this,(long)(this->_m_openQueue->c).
                                     super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_m_openQueue->c).
                                     super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    poVar2 = std::operator<<(poVar2," per joint policy), pruned ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", full policies ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"( ");
    dVar4 = GetPerJPRatio(this,this->_m_nrNodesFullySpecified);
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2," pjp )");
    poVar2 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound ");
    std::__cxx11::stringbuf::str();
    poVar2 = std::operator<<(poVar2,local_1c0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stats);
  }
  return;
}

Assistant:

void PrintStatistics(Index i) const
    {
#define PRINTNUM 100000
        Index printNum = PRINTNUM;
        if(_m_verbosity>1)
        {
            // limit the second argument of pow(), otherwise we get SIGFPE
            printNum /= pow(10,std::min(_m_verbosity-1,5));
        }
        if(_m_verbosity>=0 && i % printNum == 0 && i > printNum) 
        {
            //do not do the printing when not outputting it!
            std::stringstream stats;
            stats << i << "-th node selected for expansion:   "<<_m_openQueue->size() 
                  << " nodes in queue ( "
                  << GetPerJPRatio(_m_openQueue->size())
                  <<" per joint policy), pruned "
                  << _m_nrNodesPruned
                  << ", full policies "
                  << _m_nrNodesFullySpecified
                  << "( " << GetPerJPRatio(_m_nrNodesFullySpecified)
                  << " pjp )";
            std::cout << "BGIP_SolverBranchAndBound " << stats.str() << std::endl;
        }
    }